

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

ArrayNewFixed * __thiscall
wasm::Builder::makeArrayNewFixed<std::initializer_list<wasm::Expression*>>
          (Builder *this,HeapType type,initializer_list<wasm::Expression_*> *values)

{
  Type local_30;
  ArrayNewFixed *local_28;
  ArrayNewFixed *ret;
  initializer_list<wasm::Expression_*> *values_local;
  Builder *this_local;
  HeapType type_local;
  
  ret = (ArrayNewFixed *)values;
  values_local = (initializer_list<wasm::Expression_*> *)this;
  this_local = (Builder *)type.id;
  local_28 = MixedArena::alloc<wasm::ArrayNewFixed>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::initializer_list<wasm::Expression*>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&local_28->values,
             (initializer_list<wasm::Expression_*> *)ret);
  Type::Type(&local_30,(HeapType)this_local,NonNullable,Inexact);
  (local_28->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type.id =
       local_30.id;
  wasm::ArrayNewFixed::finalize();
  return local_28;
}

Assistant:

ArrayNewFixed* makeArrayNewFixed(HeapType type, const T& values) {
    auto* ret = wasm.allocator.alloc<ArrayNewFixed>();
    ret->values.set(values);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }